

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O2

Error asmjit::v1_14::InstAPI::instIdToString(Arch arch,InstId instId,String *output)

{
  Error EVar1;
  
  if ((byte)(arch - k32BitMask) < 2) {
    EVar1 = x86::InstInternal::instIdToString(instId,output);
    return EVar1;
  }
  if ((arch != kAArch64_BE) && (arch != kAArch64)) {
    return 4;
  }
  EVar1 = a64::InstInternal::instIdToString(instId,output);
  return EVar1;
}

Assistant:

Error InstAPI::instIdToString(Arch arch, InstId instId, String& output) noexcept {
#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::instIdToString(instId, output);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::instIdToString(instId, output);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}